

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.h
# Opt level: O1

void __thiscall
testinator::BranchScope::BranchScope(BranchScope *this,int line,char *file,char *name)

{
  bool bVar1;
  Branch *pBVar2;
  stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
  *psVar3;
  Branch *pBVar4;
  deque<testinator::Branch*,std::allocator<testinator::Branch*>> *this_00;
  _Elt_pointer ppBVar5;
  Branch *local_28;
  
  psVar3 = Branch::getStack();
  ppBVar5 = (psVar3->c).
            super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar5 ==
      (psVar3->c).super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppBVar5 = (psVar3->c).
              super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pBVar2 = ppBVar5[-1];
  this->m_parent = pBVar2;
  pBVar4 = Branch::pushChild(pBVar2,line,file,name);
  this->m_child = pBVar4;
  pBVar2 = this->m_parent;
  bVar1 = pBVar2->m_canRunChild;
  this->m_canRun = bVar1;
  if (bVar1 == false) {
    pBVar2->m_complete = false;
  }
  else {
    bVar1 = pBVar4->m_complete;
    this->m_canRun = (bool)(bVar1 ^ 1);
    if (bVar1 == false) {
      pBVar2->m_canRunChild = false;
      this_00 = (deque<testinator::Branch*,std::allocator<testinator::Branch*>> *)Branch::getStack()
      ;
      local_28 = this->m_child;
      if (*(undefined8 **)(this_00 + 0x30) == (undefined8 *)(*(long *)(this_00 + 0x40) + -8)) {
        ::std::deque<testinator::Branch*,std::allocator<testinator::Branch*>>::
        _M_push_back_aux<testinator::Branch*>(this_00,&local_28);
      }
      else {
        **(undefined8 **)(this_00 + 0x30) = local_28;
        *(long *)(this_00 + 0x30) = *(long *)(this_00 + 0x30) + 8;
      }
      this->m_child->m_complete = true;
    }
  }
  return;
}

Assistant:

BranchScope(int line, const char* file, const char* name)
      : m_parent(Branch::currentParent())
      , m_child(m_parent.pushChild(line, file, name))
    {
      m_canRun = m_parent.canRunChild();
      if (!m_canRun)
      {
        m_parent.setComplete(false);
        return;
      }
      m_canRun = !m_child.isComplete();
      if (m_canRun)
      {
        m_parent.setCanRunChild(false);
        Branch::getStack().push(&m_child);
        m_child.setComplete(true);
      }
    }